

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# steed.c
# Opt level: O3

boolean landing_spot(coord *spot,int reason,int forceit)

{
  monst *pmVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  boolean bVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  trap *ptVar9;
  obj *poVar10;
  uint x;
  uint y;
  ulong uVar11;
  int local_60;
  
  if ((((reason != 6) || (u.uprops[0x1b].intrinsic != 0)) || (u.umonnum == 0x9e)) ||
     ((((youmonst.data)->mlet == '\x1c' || (u.uprops[0x1c].intrinsic != 0)) ||
      ((u.uprops[0x25].intrinsic != 0 || (bVar3 = true, u.uprops[0x25].extrinsic != 0)))))) {
    bVar3 = false;
  }
  uVar8 = (uint)(byte)u.ux;
  local_60 = -1;
  do {
    bVar4 = false;
    x = (int)(char)uVar8 - 1;
    do {
      uVar6 = (uint)u.uy;
      uVar11 = (ulong)(uVar6 - 2);
      uVar8 = uVar6 - 1;
      do {
        y = (int)uVar11 + 1;
        uVar11 = (ulong)y;
        if ((((x - 1 < 0x4f) && (y < 0x15)) &&
            ((((y != uVar6 || (x != (int)u.ux)) && ('\x16' < level->locations[x][uVar11].typ)) &&
             ((((pmVar1 = level->monsters[x][uVar11], pmVar1 == (monst *)0x0 ||
                ((pmVar1->field_0x61 & 2) != 0)) && (bVar5 = closed_door(level,x,y), bVar5 == '\0'))
              && ((iVar7 = dist2(x,y,(int)u.ux,(int)u.uy), iVar7 < local_60 || local_60 < 0 ||
                  ((iVar7 == local_60 && (uVar6 = mt_random(), (uVar6 & 1) != 0)))))))))) &&
           ((!bVar3 ||
            (((ptVar9 = t_at(level,x,y), ptVar9 == (trap *)0x0 || ((ptVar9->field_0x8 & 0x20) == 0))
             && ((poVar10 = sobj_at(0x214,level,x,y), poVar10 == (obj *)0x0 ||
                 (((youmonst.data)->mflags2 & 0x8000000) != 0)))))))) {
          spot->x = (xchar)x;
          spot->y = (char)uVar8;
          bVar4 = true;
          local_60 = iVar7;
        }
        uVar6 = (uint)u.uy;
        uVar8 = (uint)(byte)((char)uVar8 + 1);
      } while ((int)y <= (int)uVar6);
      uVar8 = (uint)u.ux;
      bVar2 = (int)x <= (int)uVar8;
      x = x + 1;
    } while (bVar2);
    bVar2 = (bool)(bVar3 & !bVar4);
    bVar3 = false;
  } while (bVar2);
  if (((forceit != 0) && (local_60 < 0)) &&
     (bVar5 = enexto(spot,level,u.ux,u.uy,youmonst.data), bVar5 == '\0')) {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

static boolean landing_spot(coord *spot, /* landing position (we fill it in) */
			    int reason, 
			    int forceit)
{
    int i = 0, x, y, distance, min_distance = -1;
    boolean found = FALSE;
    struct trap *t;

    /* avoid known traps (i == 0) and boulders, but allow them as a backup */
    if (reason != DISMOUNT_BYCHOICE || Stunned || Confusion || Fumbling) i = 1;
    for (; !found && i < 2; ++i) {
	for (x = u.ux-1; x <= u.ux+1; x++)
	    for (y = u.uy-1; y <= u.uy+1; y++) {
		if (!isok(x, y) || (x == u.ux && y == u.uy)) continue;

		if (ACCESSIBLE(level->locations[x][y].typ) &&
			    !MON_AT(level, x,y) && !closed_door(level, x,y)) {
		    distance = distu(x,y);
		    if (min_distance < 0 || distance < min_distance ||
			    (distance == min_distance && rn2(2))) {
			if (i > 0 || (((t = t_at(level, x, y)) == 0 || !t->tseen) &&
				      (!sobj_at(BOULDER, level, x, y) ||
				       throws_rocks(youmonst.data)))) {
			    spot->x = x;
			    spot->y = y;
			    min_distance = distance;
			    found = TRUE;
			}
		    }
		}
	    }
    }

    /* If we didn't find a good spot and forceit is on, try enexto(). */
    if (forceit && min_distance < 0 &&
		!enexto(spot, level, u.ux, u.uy, youmonst.data))
	return FALSE;

    return found;
}